

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-string-view.cc
# Opt level: O1

void __thiscall string_view_find_first_of3_Test::TestBody(string_view_find_first_of3_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionResult gtest_ar;
  string_view local_50;
  AssertHelper local_40;
  internal local_38 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  uint local_24;
  
  local_24 = 0;
  local_50.data_ = "0123abc";
  local_50.size_ = 7;
  local_40.data_ = (AssertHelperData *)wabt::string_view::find_first_of(&local_50,"0a",0);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            (local_38,"0U","string_view(\"0123abc\").find_first_of(\"0a\")",&local_24,
             (unsigned_long *)&local_40);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_50);
    if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
               ,0x158,pcVar2);
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if ((long *)local_50.data_ != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_50.data_ != (long *)0x0)) {
        (**(code **)(*(long *)local_50.data_ + 8))();
      }
      local_50.data_ = (char *)0x0;
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  }
  else {
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_24 = 0;
    local_50.data_ = "0123abc";
    local_50.size_ = 7;
    local_40.data_ = (AssertHelperData *)wabt::string_view::find_first_of(&local_50,"0a",0);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (local_38,"0U","string_view(\"0123abc\").find_first_of(\"0a\", 0)",&local_24,
               (unsigned_long *)&local_40);
    if (local_38[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_50);
      if (local_30.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar2 = "";
      }
      else {
        pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_40,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                 ,0x159,pcVar2);
      testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
      testing::internal::AssertHelper::~AssertHelper(&local_40);
      if ((long *)local_50.data_ != (long *)0x0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) && ((long *)local_50.data_ != (long *)0x0)) {
          (**(code **)(*(long *)local_50.data_ + 8))();
        }
        local_50.data_ = (char *)0x0;
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    }
    else {
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_24 = 4;
      local_50.data_ = "0123abc";
      local_50.size_ = 7;
      local_40.data_ = (AssertHelperData *)wabt::string_view::find_first_of(&local_50,"0a",1);
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
                (local_38,"4U","string_view(\"0123abc\").find_first_of(\"0a\", 1)",&local_24,
                 (unsigned_long *)&local_40);
      if (local_38[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_50);
        if (local_30.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar2 = "";
        }
        else {
          pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                   ,0x15a,pcVar2);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if ((long *)local_50.data_ != (long *)0x0) {
          bVar1 = testing::internal::IsTrue(true);
          if ((bVar1) && ((long *)local_50.data_ != (long *)0x0)) {
            (**(code **)(*(long *)local_50.data_ + 8))();
          }
          local_50.data_ = (char *)0x0;
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        local_50.data_ = "0123abc";
        local_50.size_ = 7;
        local_40.data_ = (AssertHelperData *)wabt::string_view::find_first_of(&local_50,"0a",5);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  (local_38,"npos","string_view(\"0123abc\").find_first_of(\"0a\", 5)",
                   &(anonymous_namespace)::npos,(unsigned_long *)&local_40);
        if (local_38[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_50);
          if (local_30.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar2 = "";
          }
          else {
            pcVar2 = ((local_30.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/test-string-view.cc"
                     ,0x15b,pcVar2);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_50);
          testing::internal::AssertHelper::~AssertHelper(&local_40);
          if ((long *)local_50.data_ != (long *)0x0) {
            bVar1 = testing::internal::IsTrue(true);
            if ((bVar1) && ((long *)local_50.data_ != (long *)0x0)) {
              (**(code **)(*(long *)local_50.data_ + 8))();
            }
            local_50.data_ = (char *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_30,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  return;
}

Assistant:

TEST(string_view, find_first_of3) {
  ASSERT_EQ(0U, string_view("0123abc").find_first_of("0a"));
  ASSERT_EQ(0U, string_view("0123abc").find_first_of("0a", 0));
  ASSERT_EQ(4U, string_view("0123abc").find_first_of("0a", 1));
  ASSERT_EQ(npos, string_view("0123abc").find_first_of("0a", 5));
}